

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O2

void google::protobuf::compiler::StripSourceRetentionOptions
               (DescriptorPool *pool,FileDescriptorProto *file_proto)

{
  int *__first1;
  long lVar1;
  SourceCodeInfo_Location *value;
  pointer ppSVar2;
  pointer ppSVar3;
  bool bVar4;
  SourceCodeInfo *pSVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar6;
  size_t sVar7;
  int *__last2;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this;
  size_t i;
  ulong uVar8;
  int index;
  lts_20250127 *this_00;
  pointer ppVar9;
  Span<const_int> SVar10;
  vector<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  old_locations;
  key_arg<int> local_8c;
  vector<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
  sorted_locations;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  indices_to_delete;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  stripped_paths;
  
  stripped_paths.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stripped_paths.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stripped_paths.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&file_proto->super_Message,pool,&stripped_paths);
  bVar4 = FileDescriptorProto::has_source_code_info(file_proto);
  if (bVar4) {
    pSVar5 = FileDescriptorProto::mutable_source_code_info(file_proto);
    sorted_locations.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sorted_locations.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sorted_locations.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ::reserve(&sorted_locations,(long)*(int *)((long)&pSVar5->field_0 + 0x20));
    this = &(pSVar5->field_0)._impl_.location_;
    index = 0;
    while (indices_to_delete.
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_ = CONCAT44(indices_to_delete.
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.capacity_._4_4_,index),
          index < *(int *)((long)&pSVar5->field_0 + 0x20)) {
      pVVar6 = protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                         (&this->super_RepeatedPtrFieldBase,index);
      std::
      vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>
      ::emplace_back<google::protobuf::RepeatedField<int>const&,int&>
                ((vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>
                  *)&sorted_locations,&(pVVar6->field_0)._impl_.path_,(int *)&indices_to_delete);
      index = (int)indices_to_delete.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_ + 1;
    }
    absl::lts_20250127::
    c_sort<std::vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>>
              (&sorted_locations);
    absl::lts_20250127::
    c_sort<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              (&stripped_paths);
    indices_to_delete.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    indices_to_delete.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    this_00 = (lts_20250127 *)
              stripped_paths.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = sorted_locations.
             super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_00b6fb3d:
    do {
      if ((this_00 ==
           (lts_20250127 *)
           stripped_paths.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (ppVar9 == sorted_locations.
                    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00b6fbbb;
      __first1 = *(int **)this_00;
      lVar1 = *(long *)(this_00 + 8);
      old_locations.
      super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(ppVar9->first).ptr_;
      old_locations.
      super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ppVar9->first).len_;
      SVar10 = absl::lts_20250127::Span<const_int>::subspan
                         ((Span<const_int> *)&old_locations,0,lVar1 - (long)__first1 >> 2);
      __last2 = SVar10.ptr_ + SVar10.len_;
      bVar4 = std::__equal4<int_const*,int_const*>
                        (__first1,(int *)((lVar1 - (long)__first1) + (long)__first1),SVar10.ptr_,
                         __last2);
      if (bVar4) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::emplace<const_int_&,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                    *)&old_locations,
                   &indices_to_delete.
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   ,&ppVar9->second);
      }
      else {
        SVar10.len_ = (size_type)__last2;
        SVar10.ptr_ = (pointer)(ppVar9->first).len_;
        bVar4 = absl::lts_20250127::operator<
                          (this_00,(vector<int,_std::allocator<int>_> *)(ppVar9->first).ptr_,SVar10)
        ;
        if (bVar4) {
          this_00 = this_00 + 0x18;
          goto LAB_00b6fb3d;
        }
      }
      ppVar9 = ppVar9 + 1;
    } while( true );
  }
LAB_00b6fc8f:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&stripped_paths);
  return;
LAB_00b6fbbb:
  old_locations.
  super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_locations.
  super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  old_locations.
  super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  ::resize(&old_locations,(long)*(int *)((long)&pSVar5->field_0 + 0x20));
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::ExtractSubrange
            (this,0,*(int *)((long)&pSVar5->field_0 + 0x20),
             old_locations.
             super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppSVar3 = old_locations.
            super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppSVar2 = old_locations.
            super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
          ::size(&indices_to_delete.
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                );
  protobuf::internal::RepeatedPtrFieldBase::Reserve
            (&this->super_RepeatedPtrFieldBase,
             (int)((ulong)((long)ppSVar3 - (long)ppSVar2) >> 3) - (int)sVar7);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)old_locations.
                            super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)old_locations.
                            super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    local_8c = (key_arg<int>)uVar8;
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::contains<int>(&indices_to_delete.
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                            ,&local_8c);
    value = old_locations.
            super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar8];
    if (bVar4) {
      if (value != (SourceCodeInfo_Location *)0x0) {
        SourceCodeInfo_Location::~SourceCodeInfo_Location(value);
      }
      operator_delete(value,0x70);
    }
    else {
      protobuf::internal::RepeatedPtrFieldBase::
      AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                (&this->super_RepeatedPtrFieldBase,value);
    }
  }
  std::
  _Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  ::~_Vector_base(&old_locations.
                   super__Vector_base<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
                 );
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~raw_hash_set(&indices_to_delete.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                 );
  std::
  _Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
  ::~_Vector_base(&sorted_locations.
                   super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                 );
  goto LAB_00b6fc8f;
}

Assistant:

void StripSourceRetentionOptions(const DescriptorPool& pool,
                                 FileDescriptorProto& file_proto) {
  std::vector<std::vector<int>> stripped_paths;
  ConvertToDynamicMessageAndStripOptions(file_proto, pool, &stripped_paths);
  if (file_proto.has_source_code_info()) {
    StripSourceCodeInfo(stripped_paths, *file_proto.mutable_source_code_info());
  }
}